

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall VM::exec(VM *this)

{
  uchar **__x;
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  pointer ppSVar4;
  FunctionInformation *pFVar5;
  pointer ppuVar6;
  StackFrame *pSVar7;
  StackFrame **arguments;
  size_t i_1;
  size_t argcount;
  uchar **out;
  bool bVar8;
  size_t i;
  size_t sVar9;
  int offset;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_48;
  uchar **local_40;
  size_t sz;
  
  __x = &this->cip;
  local_40 = &this->rsp;
  local_48 = &this->retstack;
  out = local_40;
  do {
    puVar3 = *__x;
    uVar1 = *puVar3;
    *__x = puVar3 + 1;
    switch(uVar1) {
    case '\0':
      iVar2 = *(int *)(puVar3 + 1);
      this->cip = puVar3 + 5;
      push(this,puVar3 + 5,(long)iVar2);
      this->cip = this->cip + iVar2;
      break;
    case '\x02':
      pop<unsigned_long>(this,&sz);
      pop<void*>(this,(void **)&offset);
      push(this,_offset,sz);
      break;
    case '\x03':
      ppSVar4 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar7 = ppSVar4[-2];
      memcpy(*(void **)ppSVar4[-1]->ptr,pSVar7->ptr,pSVar7->size);
      pop(this);
    case '\x01':
      pop(this);
      break;
    case '\x04':
      pop<int>(this,&offset);
      pSVar7 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
      bVar8 = false;
      for (sVar9 = 0; pSVar7->size != sVar9; sVar9 = sVar9 + 1) {
        bVar8 = (bool)(bVar8 | pSVar7->ptr[sVar9] != '\0');
      }
      pop(this);
      if (bVar8) {
        this->cip = this->firmware + offset;
      }
      break;
    case '\x05':
      iVar2 = *(int *)(puVar3 + 1);
      this->cip = puVar3 + 5;
      pFVar5 = this->imports;
      if (pFVar5[iVar2].isExternal == true) {
        argcount = (size_t)pFVar5[iVar2].argcount;
        arguments = (StackFrame **)
                    operator_new__(-(ulong)(argcount + 1 >> 0x3d != 0) | argcount * 8 + 8);
        sVar9 = argcount;
        while (sVar9 = sVar9 - 1, sVar9 != 0xffffffffffffffff) {
          arguments[sVar9] =
               (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
          rmstack(this);
        }
        platform_call_wrapper
                  (pFVar5[iVar2].ptr,arguments,argcount,(long)pFVar5[iVar2].outsize,
                   pFVar5[iVar2].isVarArgs,this);
        for (sVar9 = 0; argcount != sVar9; sVar9 = sVar9 + 1) {
          pSVar7 = arguments[sVar9];
          if (pSVar7 != (StackFrame *)0x0) {
            StackFrame::~StackFrame(pSVar7);
          }
          operator_delete(pSVar7);
        }
        operator_delete__(arguments);
        out = local_40;
      }
      else {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(local_48,__x);
        this->cip = this->programBase + pFVar5[iVar2].offset;
      }
      break;
    case '\x06':
      ppuVar6 = (this->retstack).
                super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppuVar6 ==
          (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      this->cip = ppuVar6[-1];
      (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppuVar6 + -1;
      break;
    case '\a':
      pop<unsigned_char*>(this,out);
      break;
    case '\b':
      push(this,out,8);
      break;
    case '\t':
      _offset = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1]->ptr;
      push(this,&offset,8);
      ppSVar4 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppSVar4[-1]->vref = ppSVar4[-2];
      break;
    default:
      puts("Illegal instruction");
      abort();
    }
  } while( true );
}

Assistant:

void exec() {
    while(1) {
    unsigned char opcode;
    unsigned char* oldip = cip;
    read(opcode);
    switch(opcode) {
    case 0:
    {
      //PUSH constant
      int len;
      read(len);
      push(cip,len);
      cip+=len;
    }
      break;
    case 1:
    {
      //POP
      pop();
    }
      break;
    case 2:
    {
      //Load
      void* addr;
      size_t sz;
      pop(sz);
      pop(addr);
      push(addr,sz);
    }
      break;
    case 3:
    {
      //Store
      StackFrame* val = stack[stack.size()-2];
      StackFrame* addr_val = stack[stack.size()-1];
      void* addr;
      memcpy(&addr,addr_val->ptr,sizeof(void*));
      memcpy(addr,val->ptr,val->size);
      pop();
      pop();
    }
      break;
    case 4:
    {
      //Absolute branch
      int offset;
      pop(offset);
      bool shouldBranch = false;
      
      StackFrame* frame = stack.back();
      for(size_t i = 0;i<frame->size;i++) {
	if(frame->ptr[i]) {
	  shouldBranch = true;
	}
      }
      
      pop();
      if(shouldBranch) {
	cip =firmware+offset;
      }
    }
      break;
    case 5:
    {
      //Procedure call
      int funcid;
      read(funcid);
      FunctionInformation* info = imports+funcid;
      size_t argcount = info->argcount;
      if(info->isExternal) {
      StackFrame** args = new StackFrame*[argcount+1];
      for(size_t i = 0;i<argcount;i++) {
	args[argcount-i-1] = stack.back();
	rmstack();
      }
      
      platform_call_wrapper(info->ptr,args,argcount,info->outsize,info->isVarArgs,this);
      for(size_t i = 0;i<argcount;i++) {
	delete args[i];
      }
      delete[] args;
      }else {
	retstack.push_back(cip);
	cip = programBase+info->offset;
      }
    }
      break;
    case 6:
    {
      //Procedure call return/exit
      if(!retstack.size()) {
	return;
      }
      cip = retstack.back();
      retstack.pop_back();
    }
      break;
    case 7:
    {
      //Set stack pointer
      pop(rsp);
    }
      break;
    case 8:
    {
      //Read stack pointer
      push(&rsp,sizeof(rsp));
    }
      break;
    case 9:
    {
      //This pointer (reference)
      void* addr = stack.back()->ptr;
      push(&addr,sizeof(addr));
      stack.back()->vref = stack[stack.size()-2];
    }
      break;
    default:
    {
      printf("Illegal instruction\n");
      abort();
    }
      break;
  }
    }
  }